

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynYield * ParseYield(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynBase *pSVar2;
  undefined4 extraout_var;
  SynYield *this;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_yield) {
    ctx->currentLexeme = begin + 1;
    pSVar2 = ParseAssignment(ctx);
    anon_unknown.dwarf_1613e::CheckConsume
              (ctx,lex_semicolon,"ERROR: yield statement must be followed by an expression or \';\'"
              );
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (SynYield *)CONCAT44(extraout_var,iVar1);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    SynBase::SynBase((SynBase *)this,0x23,begin,ctx->currentLexeme + -1);
    (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00228c00;
    this->value = pSVar2;
  }
  else {
    this = (SynYield *)0x0;
  }
  return this;
}

Assistant:

SynYield* ParseYield(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_yield))
	{
		// Optional
		SynBase *value = ParseAssignment(ctx);

		CheckConsume(ctx, lex_semicolon, "ERROR: yield statement must be followed by an expression or ';'");

		return new (ctx.get<SynYield>()) SynYield(start, ctx.Previous(), value);
	}

	return NULL;
}